

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O3

int __thiscall
Yolact::draw(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  int iVar9;
  pointer pOVar10;
  double dVar11;
  __m128 t_2;
  __m128 t;
  int baseLine;
  long *local_1f8;
  Mat *pMStack_1f0;
  long local_1e8 [3];
  int local_1cc;
  Size label_size;
  int local_1c0;
  int local_1bc;
  undefined4 local_1b8 [2];
  Mat *local_1b0;
  undefined8 local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  vector<Object,_std::allocator<Object>_> *local_180;
  double local_178;
  long local_170;
  double local_168;
  double dStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char text [256];
  
  local_170 = 0;
  iVar9 = 0;
  local_180 = objects;
  do {
    pOVar10 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_start;
    dVar11 = (double)pOVar10[local_170].prob;
    if (0.15 <= dVar11) {
      pOVar10 = pOVar10 + local_170;
      fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",dVar11,(double)(pOVar10->rect).x,
              (double)(pOVar10->rect).y,(double)(pOVar10->rect).width,(double)(pOVar10->rect).height
              ,(ulong)(uint)pOVar10->label);
      local_1e8[0] = 0;
      local_1f8 = (long *)CONCAT44(local_1f8._4_4_,0x3010000);
      local_190 = (int)ROUND((pOVar10->rect).x);
      local_18c = (int)ROUND((pOVar10->rect).y);
      local_188 = (int)ROUND((pOVar10->rect).width);
      local_184 = (int)ROUND((pOVar10->rect).height);
      local_178 = (double)draw::colors[iVar9][2];
      local_168 = (double)(*(ushort *)draw::colors[iVar9] & 0xff);
      dStack_160 = (double)(byte)(*(ushort *)draw::colors[iVar9] >> 8);
      text[0x18] = '\0';
      text[0x19] = '\0';
      text[0x1a] = '\0';
      text[0x1b] = '\0';
      text[0x1c] = '\0';
      text[0x1d] = '\0';
      text[0x1e] = '\0';
      text[0x1f] = '\0';
      pMStack_1f0 = image;
      local_1cc = iVar9;
      text._0_8_ = local_168;
      text._8_8_ = dStack_160;
      text._16_8_ = local_178;
      cv::rectangle((string *)&local_1f8,&local_190,text,1,8,0);
      sprintf(text,"%s %.1f%%",(double)(pOVar10->prob * 100.0),draw::class_names[pOVar10->label]);
      local_1f8 = local_1e8;
      sVar5 = strlen(text);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,text,text + sVar5);
      cv::getTextSize((string *)&label_size,(int)(string *)&local_1f8,0.5,0,(int *)0x1);
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      iVar4 = (int)(pOVar10->rect).x;
      iVar9 = (int)(((pOVar10->rect).y - (float)label_size.height) - 0.0);
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar3 = *(int *)(image + 0xc) - label_size.width;
      if (label_size.width + iVar4 <= *(int *)(image + 0xc)) {
        iVar3 = iVar4;
      }
      local_1a8 = 0;
      local_1b8[0] = 0x3010000;
      local_198 = label_size.width;
      local_1f8 = (long *)0x406fe00000000000;
      pMStack_1f0 = (Mat *)0x406fe00000000000;
      local_1e8[0] = 0x406fe00000000000;
      local_1e8[1] = 0;
      local_1b0 = image;
      local_1a0 = iVar3;
      local_19c = iVar9;
      cv::rectangle(local_1b8,&local_1a0,(string *)&local_1f8,0xffffffff,8,0);
      local_1a8 = 0;
      local_1b8[0] = 0x3010000;
      local_1f8 = local_1e8;
      local_1b0 = image;
      sVar5 = strlen(text);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,text,text + sVar5);
      local_1bc = iVar9 + label_size.height;
      local_158 = 0;
      uStack_150 = 0;
      local_148 = 0;
      uStack_140 = 0;
      local_1c0 = iVar3;
      cv::putText(0x3fe0000000000000,local_1b8,(string *)&local_1f8,&local_1c0,0,&local_158,1,8,0);
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      iVar9 = *(int *)(image + 8);
      if (0 < iVar9) {
        iVar4 = *(int *)(image + 0xc);
        lVar6 = 0;
        do {
          if (0 < iVar4) {
            lVar1 = **(long **)&pOVar10->field_0x78;
            lVar2 = *(long *)&pOVar10->field_0x40;
            pbVar7 = (byte *)(*(long *)(image + 0x10) + **(long **)(image + 0x48) * lVar6 + 2);
            lVar8 = 0;
            do {
              if (*(char *)(lVar1 * lVar6 + lVar2 + lVar8) == -1) {
                iVar9 = (int)ROUND((double)pbVar7[-2] * 0.5 + local_168 * 0.5);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                if (0xfe < iVar9) {
                  iVar9 = 0xff;
                }
                pbVar7[-2] = (byte)iVar9;
                iVar9 = (int)ROUND((double)pbVar7[-1] * 0.5 + dStack_160 * 0.5);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                if (0xfe < iVar9) {
                  iVar9 = 0xff;
                }
                pbVar7[-1] = (byte)iVar9;
                iVar9 = (int)ROUND((double)*pbVar7 * 0.5 + local_178 * 0.5);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                if (0xfe < iVar9) {
                  iVar9 = 0xff;
                }
                *pbVar7 = (byte)iVar9;
                iVar4 = *(int *)(image + 0xc);
              }
              lVar8 = lVar8 + 1;
              pbVar7 = pbVar7 + 3;
            } while (lVar8 < iVar4);
            iVar9 = *(int *)(image + 8);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar9);
      }
      iVar9 = local_1cc + 1;
      objects = local_180;
    }
    local_170 = local_170 + 1;
  } while( true );
}

Assistant:

int Yolact::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    static const char* class_names[] = {"background",
                                        "person", "bicycle", "car", "motorcycle", "airplane", "bus",
                                        "train", "truck", "boat", "traffic light", "fire hydrant",
                                        "stop sign", "parking meter", "bench", "bird", "cat", "dog",
                                        "horse", "sheep", "cow", "elephant", "bear", "zebra", "giraffe",
                                        "backpack", "umbrella", "handbag", "tie", "suitcase", "frisbee",
                                        "skis", "snowboard", "sports ball", "kite", "baseball bat",
                                        "baseball glove", "skateboard", "surfboard", "tennis racket",
                                        "bottle", "wine glass", "cup", "fork", "knife", "spoon", "bowl",
                                        "banana", "apple", "sandwich", "orange", "broccoli", "carrot",
                                        "hot dog", "pizza", "donut", "cake", "chair", "couch",
                                        "potted plant", "bed", "dining table", "toilet", "tv", "laptop",
                                        "mouse", "remote", "keyboard", "cell phone", "microwave", "oven",
                                        "toaster", "sink", "refrigerator", "book", "clock", "vase",
                                        "scissors", "teddy bear", "hair drier", "toothbrush"
                                       };

    static const unsigned char colors[19][3] = {
        {244, 67, 54},
        {233, 30, 99},
        {156, 39, 176},
        {103, 58, 183},
        {63, 81, 181},
        {33, 150, 243},
        {3, 169, 244},
        {0, 188, 212},
        {0, 150, 136},
        {76, 175, 80},
        {139, 195, 74},
        {205, 220, 57},
        {255, 235, 59},
        {255, 193, 7},
        {255, 152, 0},
        {255, 87, 34},
        {121, 85, 72},
        {158, 158, 158},
        {96, 125, 139}
    };

    //cv::Mat image = bgr.clone();

    int color_index = 0;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];

        if (obj.prob < 0.15)
            continue;

        fprintf(stderr, "%d = %.5f at %.2f %.2f %.2f x %.2f\n", obj.label, obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        const unsigned char* color = colors[color_index++];

        cv::rectangle(image, obj.rect, cv::Scalar(color[0], color[1], color[2]));

        char text[256];
        sprintf(text, "%s %.1f%%", class_names[obj.label], obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));

        // draw mask
        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            uchar* p = image.ptr(y);
            for (int x = 0; x < image.cols; x++)
            {
                if (mp[x] == 255)
                {
                    p[0] = cv::saturate_cast<uchar>(p[0] * 0.5 + color[0] * 0.5);
                    p[1] = cv::saturate_cast<uchar>(p[1] * 0.5 + color[1] * 0.5);
                    p[2] = cv::saturate_cast<uchar>(p[2] * 0.5 + color[2] * 0.5);
                }
                p += 3;
            }
        }
    }

    // cv::imwrite("result.png", image);
    // cv::imshow("image", image);
    // cv::waitKey(0);
}